

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  char *in_RCX;
  char *data;
  int in_EDX;
  int sock;
  int sock_00;
  int family;
  int sock_01;
  int family_00;
  int sock_02;
  int sock_03;
  int sock_04;
  int family_01;
  int sock_05;
  int family_02;
  int sock_06;
  int family_03;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int family_04;
  int sock_11;
  int family_05;
  int sock_12;
  int family_06;
  int sock_13;
  int sock_14;
  int sock_15;
  int sock_16;
  int family_07;
  int sock_17;
  int family_08;
  int sock_18;
  int family_09;
  int sock_19;
  int sock_20;
  int sock_21;
  int sock_22;
  int in_ESI;
  long lVar4;
  int iVar5;
  
  iVar2 = test_socket_impl((char *)0x2d,in_ESI,in_EDX,(int)in_RCX);
  test_connect_impl((char *)0x2e,iVar2,sock,in_RCX);
  test_close_impl((char *)0x2f,iVar2,sock_00);
  iVar3 = test_socket_impl((char *)0x32,iVar2,family,(int)in_RCX);
  iVar2 = iVar3;
  test_connect_impl((char *)0x33,iVar3,sock_01,in_RCX);
  nn_sleep(200);
  iVar2 = test_socket_impl((char *)0x38,iVar2,family_00,(int)in_RCX);
  test_bind_impl((char *)0x39,iVar2,sock_02,in_RCX);
  test_send_impl((char *)0x3d,iVar3,0x102115,in_RCX);
  test_recv_impl((char *)0x3e,iVar2,0x102115,in_RCX);
  test_send_impl((char *)0x3f,iVar2,0x102115,in_RCX);
  test_recv_impl((char *)0x40,iVar3,0x102115,in_RCX);
  iVar5 = 100;
  do {
    test_send_impl((char *)0x45,iVar3,0x10213e,in_RCX);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = 100;
  do {
    test_recv_impl((char *)0x48,iVar2,0x10213e,in_RCX);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  __ptr = malloc(10000);
  cVar1 = '0';
  data = (char *)0x0;
  lVar4 = 0;
  do {
    *(char *)((long)__ptr + lVar4) = cVar1 + (char)((ulong)data / 10) * -10;
    lVar4 = lVar4 + 1;
    cVar1 = cVar1 + '\x01';
    data = (char *)(ulong)((int)data + 1);
  } while (lVar4 != 10000);
  *(undefined1 *)((long)__ptr + 9999) = 0;
  test_send_impl((char *)0x52,iVar3,(int)__ptr,data);
  test_recv_impl((char *)0x53,iVar2,(int)__ptr,data);
  free(__ptr);
  test_close_impl((char *)0x56,iVar3,sock_03);
  test_close_impl((char *)0x57,iVar2,sock_04);
  iVar3 = test_socket_impl((char *)0x5a,iVar2,family_01,(int)data);
  iVar2 = iVar3;
  test_bind_impl((char *)0x5b,iVar3,sock_05,data);
  iVar5 = test_socket_impl((char *)0x5c,iVar2,family_02,(int)data);
  iVar2 = iVar5;
  test_connect_impl((char *)0x5d,iVar5,sock_06,data);
  iVar2 = test_socket_impl((char *)0x5e,iVar2,family_03,(int)data);
  test_connect_impl((char *)0x5f,iVar2,sock_07,data);
  nn_sleep(100);
  test_close_impl((char *)0x61,iVar2,sock_08);
  test_close_impl((char *)0x62,iVar5,sock_09);
  test_close_impl((char *)0x63,iVar3,sock_10);
  iVar3 = test_socket_impl((char *)0x66,iVar3,family_04,(int)data);
  iVar2 = iVar3;
  test_bind_impl((char *)0x67,iVar3,sock_11,data);
  iVar5 = test_socket_impl((char *)0x68,iVar2,family_05,(int)data);
  iVar2 = iVar5;
  test_bind_impl((char *)0x69,iVar5,sock_12,data);
  iVar2 = test_socket_impl((char *)0x6a,iVar2,family_06,(int)data);
  test_connect_impl((char *)0x6b,iVar2,sock_13,data);
  nn_sleep(100);
  test_send_impl((char *)0x6d,iVar3,0x102142,data);
  test_recv_impl((char *)0x6e,iVar2,0x102142,data);
  test_close_impl((char *)0x6f,iVar3,sock_14);
  test_send_impl((char *)0x70,iVar5,0x102142,data);
  test_recv_impl((char *)0x71,iVar2,0x102142,data);
  test_close_impl((char *)0x72,iVar2,sock_15);
  test_close_impl((char *)0x73,iVar5,sock_16);
  iVar3 = test_socket_impl((char *)0x76,iVar5,family_07,(int)data);
  iVar2 = iVar3;
  test_bind_impl((char *)0x77,iVar3,sock_17,data);
  nn_sleep(100);
  iVar5 = test_socket_impl((char *)0x79,iVar2,family_08,(int)data);
  iVar2 = iVar5;
  test_bind_impl((char *)0x7a,iVar5,sock_18,data);
  iVar2 = test_socket_impl((char *)0x7b,iVar2,family_09,(int)data);
  test_connect_impl((char *)0x7c,iVar2,sock_19,data);
  nn_sleep(100);
  test_send_impl((char *)0x7e,iVar3,0x102142,data);
  test_recv_impl((char *)0x7f,iVar2,0x102142,data);
  test_close_impl((char *)0x80,iVar5,sock_20);
  test_send_impl((char *)0x81,iVar3,0x102142,data);
  test_recv_impl((char *)0x82,iVar2,0x102142,data);
  test_close_impl((char *)0x83,iVar3,sock_21);
  test_close_impl((char *)0x84,iVar2,sock_22);
  return 0;
}

Assistant:

int main ()
{
    int sb;
    int sc;
    int i;
    int s1, s2;

    int size;
    char * buf;

    /*  Try closing a IPC socket while it not connected. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    /*  Leave enough time for at least one re-connect attempt. */
    nn_sleep (200);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);

    /*  Ping-pong test. */
    for (i = 0; i != 1; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
        test_recv (sb, "0123456789012345678901234567890123456789");
        test_send (sb, "0123456789012345678901234567890123456789");
        test_recv (sc, "0123456789012345678901234567890123456789");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "XYZ");
    }

    /*  Send something large enough to trigger overlapped I/O on Windows. */
    size = 10000;
    buf = malloc (size);
    for (i = 0; i < size; ++i) {
        buf[i] = 48 + i % 10;
    }
    buf[size-1] = '\0';
    test_send (sc, buf);
    test_recv (sb, buf);
    free (buf);

    test_close (sc);
    test_close (sb);

    /*  Test whether connection rejection is handled decently. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_connect (s1, SOCKET_ADDRESS);
    s2 = test_socket (AF_SP, NN_PAIR);
    test_connect (s2, SOCKET_ADDRESS);
    nn_sleep (100);
    test_close (s2);
    test_close (s1);
    test_close (sb);

    /*  Test two sockets binding to the same address. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_send (s1, "ABC");
    test_recv (sc, "ABC");   
    test_close (sc);
    test_close (s1);

    /*  Test closing a socket that is waiting to bind. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    nn_sleep (100);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (s1);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_close (sc);

    return 0;
}